

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# City.cpp
# Opt level: O0

void CityHashCrc256Long(char *s,size_t len,uint32 seed,uint64 *result)

{
  uint64 uVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint64 uVar7;
  uint64 uVar8;
  uint64 uVar9;
  uint64 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  uint64 uVar16;
  long lVar17;
  long lVar18;
  uint64 *in_RCX;
  uint in_EDX;
  ulong in_RSI;
  uint64 old_a_7;
  uint64 old_a_6;
  uint64 old_a_5;
  uint64 old_a_4;
  uint64 old_a_3;
  uint64 old_a_2;
  uint64 old_a_1;
  uint64 old_a;
  size_t iters;
  uint64 t;
  uint64 j;
  uint64 i;
  uint64 h;
  uint64 g;
  uint64 f;
  uint64 e;
  uint64 d;
  uint64 c;
  uint64 b;
  uint64 a;
  uint64 in_stack_fffffffffffffb88;
  uint64 in_stack_fffffffffffffb90;
  ulong local_300;
  uint64 local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  ulong local_2d0;
  uint64 local_2c8;
  uint64 local_2c0;
  uint64 local_2b8;
  uint64 local_2b0;
  uint64 local_2a8;
  ulong local_290;
  
  local_2a8 = Fetch64((char *)0x1b1767);
  local_2a8 = local_2a8 + 0xc3a5c85c97cb3127;
  local_2b0 = Fetch64((char *)0x1b178d);
  local_2b0 = local_2b0 + 0xc3a5c85c97cb3127;
  local_2b8 = HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  *in_RCX = local_2b8;
  uVar1 = Fetch64((char *)0x1b17db);
  local_2c0 = uVar1 * -0x3c5a37a36834ced9 + in_RSI;
  in_RCX[1] = local_2c0;
  local_2c8 = Fetch64((char *)0x1b1819);
  local_2c8 = local_2c8 + in_EDX;
  local_2d0 = (ulong)in_EDX;
  local_2d8 = 0;
  local_2e0 = 0;
  local_2e8 = 0;
  local_2f0 = 0;
  local_2f8 = local_2b8 + local_2c0;
  local_300 = in_RSI / 0xf0;
  local_290 = in_RSI % 0xf0;
  do {
    uVar1 = Rotate(local_2b0,0x28);
    uVar2 = Fetch64((char *)0x1b18f3);
    uVar3 = Rotate(local_2b8,0x1a);
    uVar4 = Fetch64((char *)0x1b1932);
    uVar5 = Rotate(local_2c0,0x28);
    uVar6 = Fetch64((char *)0x1b1971);
    uVar7 = Rotate(local_2c8,0x20);
    uVar8 = Fetch64((char *)0x1b19b0);
    uVar9 = Rotate(local_2f8,0x18);
    uVar10 = Fetch64((char *)0x1b19ef);
    uVar11 = crc32(local_2d0,uVar1 + uVar2);
    uVar12 = crc32(local_2d8,uVar3 + uVar4);
    uVar13 = crc32(local_2e0,uVar5 + uVar6);
    uVar14 = crc32(local_2e8,uVar7 + uVar8);
    uVar15 = crc32(local_2f0,uVar9 + uVar10);
    uVar3 = Rotate(uVar3 + uVar4,0x29);
    uVar4 = Fetch64((char *)0x1b1b92);
    uVar4 = uVar3 * -0x3c5a37a36834ced9 + uVar4;
    uVar3 = Rotate(uVar5 + uVar6,0x1b);
    uVar5 = Fetch64((char *)0x1b1be1);
    uVar5 = uVar3 * -0x3c5a37a36834ced9 + uVar5;
    uVar3 = Rotate(uVar7 + uVar8,0x29);
    uVar6 = Fetch64((char *)0x1b1c30);
    uVar6 = uVar3 * -0x3c5a37a36834ced9 + uVar6;
    uVar3 = Rotate(uVar9 + uVar10,0x21);
    uVar7 = Fetch64((char *)0x1b1c7f);
    uVar7 = uVar3 * -0x3c5a37a36834ced9 + uVar7;
    uVar3 = Rotate(local_2a8,0x19);
    uVar8 = Fetch64((char *)0x1b1cce);
    uVar8 = uVar3 * -0x3c5a37a36834ced9 + uVar8;
    uVar11 = crc32(uVar11,uVar4);
    uVar12 = crc32(uVar12,uVar5);
    uVar13 = crc32(uVar13,uVar6);
    uVar14 = crc32(uVar14,uVar7);
    uVar15 = crc32(uVar15,uVar8);
    uVar3 = Rotate(uVar5,0x28);
    uVar5 = Fetch64((char *)0x1b1e6a);
    uVar6 = Rotate(uVar6,0x1a);
    uVar9 = Fetch64((char *)0x1b1eaf);
    uVar7 = Rotate(uVar7,0x28);
    uVar10 = Fetch64((char *)0x1b1ef4);
    uVar8 = Rotate(uVar8,0x20);
    uVar16 = Fetch64((char *)0x1b1f39);
    uVar1 = Rotate(uVar1 + uVar2,0x18);
    uVar2 = Fetch64((char *)0x1b1f7e);
    uVar11 = crc32(uVar11,uVar3 + uVar5);
    uVar12 = crc32(uVar12,uVar6 + uVar9);
    uVar13 = crc32(uVar13,uVar7 + uVar10);
    uVar14 = crc32(uVar14,uVar8 + uVar16);
    uVar15 = crc32(uVar15,uVar1 + uVar2);
    uVar6 = Rotate(uVar6 + uVar9,0x29);
    uVar9 = Fetch64((char *)0x1b2124);
    uVar9 = uVar6 * -0x3c5a37a36834ced9 + uVar9;
    uVar6 = Rotate(uVar7 + uVar10,0x1b);
    uVar7 = Fetch64((char *)0x1b2173);
    uVar7 = uVar6 * -0x3c5a37a36834ced9 + uVar7;
    uVar6 = Rotate(uVar8 + uVar16,0x29);
    uVar8 = Fetch64((char *)0x1b21c2);
    uVar8 = uVar6 * -0x3c5a37a36834ced9 + uVar8;
    uVar1 = Rotate(uVar1 + uVar2,0x21);
    uVar2 = Fetch64((char *)0x1b2211);
    uVar2 = uVar1 * -0x3c5a37a36834ced9 + uVar2;
    uVar1 = Rotate(uVar4,0x19);
    uVar4 = Fetch64((char *)0x1b2260);
    uVar4 = uVar1 * -0x3c5a37a36834ced9 + uVar4;
    uVar11 = crc32(uVar11,uVar9);
    uVar12 = crc32(uVar12,uVar7);
    uVar13 = crc32(uVar13,uVar8);
    uVar14 = crc32(uVar14,uVar2);
    uVar15 = crc32(uVar15,uVar4);
    local_2f8 = Rotate(uVar7,0x28);
    uVar1 = Fetch64((char *)0x1b23fc);
    local_2f8 = local_2f8 + uVar1;
    uVar1 = Rotate(uVar8,0x1a);
    uVar6 = Fetch64((char *)0x1b2441);
    uVar2 = Rotate(uVar2,0x28);
    uVar7 = Fetch64((char *)0x1b2486);
    uVar4 = Rotate(uVar4,0x20);
    uVar8 = Fetch64((char *)0x1b24cb);
    uVar3 = Rotate(uVar3 + uVar5,0x18);
    uVar5 = Fetch64((char *)0x1b2510);
    uVar11 = crc32(uVar11,local_2f8);
    uVar12 = crc32(uVar12,uVar1 + uVar6);
    uVar13 = crc32(uVar13,uVar2 + uVar7);
    uVar14 = crc32(uVar14,uVar4 + uVar8);
    uVar15 = crc32(uVar15,uVar3 + uVar5);
    uVar1 = Rotate(uVar1 + uVar6,0x29);
    local_2a8 = Fetch64((char *)0x1b26b6);
    local_2a8 = uVar1 * -0x3c5a37a36834ced9 + local_2a8;
    uVar1 = Rotate(uVar2 + uVar7,0x1b);
    local_2b0 = Fetch64((char *)0x1b2705);
    local_2b0 = uVar1 * -0x3c5a37a36834ced9 + local_2b0;
    uVar1 = Rotate(uVar4 + uVar8,0x29);
    local_2b8 = Fetch64((char *)0x1b2754);
    local_2b8 = uVar1 * -0x3c5a37a36834ced9 + local_2b8;
    uVar1 = Rotate(uVar3 + uVar5,0x21);
    local_2c0 = Fetch64((char *)0x1b27a3);
    local_2c0 = uVar1 * -0x3c5a37a36834ced9 + local_2c0;
    uVar1 = Rotate(uVar9,0x19);
    local_2c8 = Fetch64((char *)0x1b27f2);
    local_2c8 = uVar1 * -0x3c5a37a36834ced9 + local_2c8;
    local_2d0 = crc32(uVar11,local_2a8);
    local_2d8 = crc32(uVar12,local_2b0);
    local_2e0 = crc32(uVar13,local_2b8);
    local_2e8 = crc32(uVar14,local_2c0);
    local_2f0 = crc32(uVar15,local_2c8);
    local_300 = local_300 - 1;
  } while (local_300 != 0);
  for (; 0x27 < local_290; local_290 = local_290 - 0x28) {
    uVar1 = Rotate(local_2b0,0x29);
    uVar2 = Fetch64((char *)0x1b29c4);
    uVar2 = uVar1 * -0x3c5a37a36834ced9 + uVar2;
    uVar1 = Rotate(local_2b8,0x1b);
    local_2b0 = Fetch64((char *)0x1b2a0d);
    local_2b0 = uVar1 * -0x3c5a37a36834ced9 + local_2b0;
    uVar1 = Rotate(local_2c0,0x29);
    local_2b8 = Fetch64((char *)0x1b2a56);
    local_2b8 = uVar1 * -0x3c5a37a36834ced9 + local_2b8;
    uVar1 = Rotate(local_2c8,0x21);
    local_2c0 = Fetch64((char *)0x1b2a9f);
    local_2c0 = uVar1 * -0x3c5a37a36834ced9 + local_2c0;
    uVar1 = Rotate(local_2f8,0x19);
    local_2c8 = Fetch64((char *)0x1b2ae8);
    local_2c8 = uVar1 * -0x3c5a37a36834ced9 + local_2c8;
    local_2f8 = local_2a8;
    local_2d0 = crc32(local_2d0,uVar2);
    local_2d8 = crc32(local_2d8,local_2b0);
    local_2e0 = crc32(local_2e0,local_2b8);
    local_2e8 = crc32(local_2e8,local_2c0);
    local_2f0 = crc32(local_2f0,local_2c8);
    local_2a8 = uVar2;
  }
  if (local_290 != 0) {
    uVar1 = Rotate(local_2b0,0x29);
    uVar2 = Fetch64((char *)0x1b2ccc);
    in_stack_fffffffffffffb88 = Rotate(local_2b8,0x1b);
    in_stack_fffffffffffffb88 = in_stack_fffffffffffffb88 * -0x3c5a37a36834ced9;
    local_2b0 = Fetch64((char *)0x1b2d15);
    local_2b0 = in_stack_fffffffffffffb88 + local_2b0;
    in_stack_fffffffffffffb90 = Rotate(local_2c0,0x29);
    in_stack_fffffffffffffb90 = in_stack_fffffffffffffb90 * -0x3c5a37a36834ced9;
    uVar3 = Fetch64((char *)0x1b2d5e);
    lVar17 = in_stack_fffffffffffffb90 + uVar3;
    uVar3 = Rotate(local_2c8,0x21);
    uVar4 = Fetch64((char *)0x1b2da7);
    uVar5 = Rotate(local_2f8,0x19);
    local_2c8 = Fetch64((char *)0x1b2df0);
    local_2c8 = uVar5 * -0x3c5a37a36834ced9 + local_2c8;
    crc32(local_2d0,uVar1 * -0x3c5a37a36834ced9 + uVar2);
    local_2d8 = crc32(local_2d8,local_2b0);
    local_2e0 = crc32(local_2e0,lVar17);
    local_2e8 = crc32(local_2e8,uVar3 * -0x3c5a37a36834ced9 + uVar4);
    local_2f0 = crc32(local_2f0,local_2c8);
  }
  uVar1 = HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  local_2e0 = (local_2d8 << 0x20) + local_2e0;
  uVar2 = HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  uVar3 = HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  lVar17 = uVar3 + local_2c8 + (local_2e8 << 0x20) + local_2f0;
  uVar3 = HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  uVar4 = HashLen16(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  lVar18 = uVar4 + uVar2 + local_2e8;
  *in_RCX = lVar17 + uVar3 + uVar1 + lVar18 + local_2e0;
  uVar1 = ShiftMix((uVar1 + lVar18) * -0x3c5a37a36834ced9);
  lVar18 = uVar1 * -0x3c5a37a36834ced9 + local_2e0 + local_2b0;
  in_RCX[1] = lVar18 + *in_RCX + in_RCX[1];
  uVar1 = ShiftMix(lVar18 * -0x3c5a37a36834ced9);
  lVar18 = uVar1 * -0x3c5a37a36834ced9 + uVar2 + local_2e8;
  in_RCX[2] = lVar18 + in_RCX[1];
  uVar1 = ShiftMix((lVar18 + lVar17) * -0x3c5a37a36834ced9);
  in_RCX[3] = uVar1 * -0x3c5a37a36834ced9 + in_RCX[2];
  return;
}

Assistant:

static void CityHashCrc256Long(const char *s, size_t len,
                               uint32 seed, uint64 *result) {
  uint64 a = Fetch64(s + 56) + k0;
  uint64 b = Fetch64(s + 96) + k0;
  uint64 c = result[0] = HashLen16(b, len);
  uint64 d = result[1] = Fetch64(s + 120) * k0 + len;
  uint64 e = Fetch64(s + 184) + seed;
  uint64 f = seed;
  uint64 g = 0;
  uint64 h = 0;
  uint64 i = 0;
  uint64 j = 0;
  uint64 t = c + d;

  // 240 bytes of input per iter.
  size_t iters = len / 240;
  len -= iters * 240;
  do {
#define CHUNK(multiplier, z)                                    \
    {                                                           \
      uint64 old_a = a;                                         \
      a = Rotate(b, 41 ^ z) * multiplier + Fetch64(s);          \
      b = Rotate(c, 27 ^ z) * multiplier + Fetch64(s + 8);      \
      c = Rotate(d, 41 ^ z) * multiplier + Fetch64(s + 16);     \
      d = Rotate(e, 33 ^ z) * multiplier + Fetch64(s + 24);     \
      e = Rotate(t, 25 ^ z) * multiplier + Fetch64(s + 32);     \
      t = old_a;                                                \
    }                                                           \
    f = _mm_crc32_u64(f, a);                                    \
    g = _mm_crc32_u64(g, b);                                    \
    h = _mm_crc32_u64(h, c);                                    \
    i = _mm_crc32_u64(i, d);                                    \
    j = _mm_crc32_u64(j, e);                                    \
    s += 40

    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
    CHUNK(1, 1); CHUNK(k0, 0);
  } while (--iters > 0);

  while (len >= 40) {
    CHUNK(k0, 0);
    len -= 40;
  }
  if (len > 0) {
    s = s + len - 40;
    CHUNK(k0, 0);
  }
  j += i << 32;
  a = HashLen16(a, j);
  h += g << 32;
  b += h;
  c = HashLen16(c, f) + i;
  d = HashLen16(d, e + result[0]);
  j += e;
  i += HashLen16(h, t);
  e = HashLen16(a, d) + j;
  f = HashLen16(b, c) + a;
  g = HashLen16(j, i) + c;
  result[0] = e + f + g + h;
  a = ShiftMix((a + g) * k0) * k0 + b;
  result[1] += a + result[0];
  a = ShiftMix(a * k0) * k0 + c;
  result[2] = a + result[1];
  a = ShiftMix((a + e) * k0) * k0;
  result[3] = a + result[2];
}